

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O1

int coda_data_dictionary_find_definition_for_product
              (coda_product *product,coda_product_definition **definition)

{
  coda_format cVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  coda_cursor cursor;
  coda_cursor local_320;
  
  iVar2 = coda_cursor_set_product(&local_320,product);
  iVar3 = -1;
  if (iVar2 == 0) {
    cVar1 = product->format;
    plVar4 = (long *)__tls_get_addr(&PTR_001e0f50);
    iVar3 = coda_evaluate_detection_node
                      (*(coda_detection_node **)
                        (*plVar4 + 0x18 + (ulong)(cVar1 + (cVar1 == coda_format_ascii)) * 8),
                       &local_320,definition);
  }
  return iVar3;
}

Assistant:

int coda_data_dictionary_find_definition_for_product(coda_product *product, coda_product_definition **definition)
{
    coda_cursor cursor;

    if (coda_cursor_set_product(&cursor, product) != 0)
    {
        return -1;
    }

    return coda_evaluate_detection_node(coda_data_dictionary_get_detection_tree(product->format), &cursor, definition);
}